

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
spvtools::val::Function::CheckLimitations
          (Function *this,ValidationState_t *_,Function *entry_point,string *reason)

{
  char cVar1;
  ostream *poVar2;
  bool bVar3;
  list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  *plVar4;
  _List_node_base *p_Var5;
  string message;
  stringstream ss_reason;
  char *local_1f0;
  long local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  Function *local_1d0;
  char **local_1c8;
  Function *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = entry_point;
  std::__cxx11::stringstream::stringstream(local_1b8);
  plVar4 = &this->limitations_;
  bVar3 = true;
  p_Var5 = (_List_node_base *)plVar4;
  do {
    p_Var5 = (((_List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar4) break;
    local_1f0 = &local_1e0;
    local_1e8 = 0;
    local_1e0 = '\0';
    local_1c0 = local_1d0;
    local_1c8 = &local_1f0;
    if (p_Var5[2]._M_next == (_List_node_base *)0x0) {
      std::__throw_bad_function_call();
    }
    cVar1 = (*(code *)p_Var5[2]._M_prev)(p_Var5 + 1,_,&local_1c0,&local_1c8);
    if (reason != (string *)0x0 && cVar1 == '\0') {
      cVar1 = '\x01';
      if (local_1e8 != 0) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_1f0,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      bVar3 = false;
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
  } while (cVar1 != '\0');
  if (p_Var5 == (_List_node_base *)plVar4) {
    if (reason == (string *)0x0 || bVar3 != false) goto LAB_001a9e2c;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)reason,(string *)&local_1f0);
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
  }
  bVar3 = false;
LAB_001a9e2c:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar3;
}

Assistant:

bool Function::CheckLimitations(const ValidationState_t& _,
                                const Function* entry_point,
                                std::string* reason) const {
  bool return_value = true;
  std::stringstream ss_reason;

  for (const auto& is_compatible : limitations_) {
    std::string message;
    if (!is_compatible(_, entry_point, &message)) {
      if (!reason) return false;
      return_value = false;
      if (!message.empty()) {
        ss_reason << message << "\n";
      }
    }
  }

  if (!return_value && reason) {
    *reason = ss_reason.str();
  }

  return return_value;
}